

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O1

void Gia_ManSatokoCall(Gia_Man_t *p,satoko_opts_t *opts,int fSplit,int fIncrem)

{
  uint n_vars;
  int *pvars;
  Cnf_Dat_t *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  satoko_t *s;
  Vec_Int_t *pVVar5;
  Gia_Man_t *p_00;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_70;
  long local_60;
  int local_54;
  Cnf_Dat_t *local_50;
  Gia_Man_t *local_48;
  long local_40;
  long local_38;
  
  if (fIncrem == 0) {
    if (fSplit == 0) {
      Gia_ManSatokoCallOne(p,opts,-1);
      return;
    }
    iVar2 = clock_gettime(3,&local_70);
    if (iVar2 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_70.tv_sec * -1000000;
    }
    pVVar5 = p->vCos;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        iVar2 = pVVar5->pArray[lVar7];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_007aa66f;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        p_00 = Gia_ManDupDfsCone(p,p->pObjs + iVar2);
        Gia_ManSatokoCallOne(p_00,opts,(int)lVar7);
        Gia_ManStop(p_00);
        lVar7 = lVar7 + 1;
        pVVar5 = p->vCos;
      } while (lVar7 < pVVar5->nSize);
    }
    iVar3 = 3;
    iVar2 = clock_gettime(3,&local_70);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    lVar7 = lVar7 + lVar6;
    Abc_Print(iVar3,"%s =","Total time");
  }
  else {
    iVar2 = clock_gettime(3,&local_70);
    if (iVar2 < 0) {
      local_60 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
      local_60 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_70.tv_sec * -1000000;
    }
    local_50 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,1,0);
    s = Gia_ManSatokoInit(local_50,opts);
    pVVar5 = p->vCos;
    if (0 < pVVar5->nSize) {
      iVar2 = 2;
      lVar6 = 0;
      local_48 = p;
      do {
        if ((pVVar5->pArray[lVar6] < 0) || (local_48->nObjs <= pVVar5->pArray[lVar6])) {
LAB_007aa66f:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (local_48->pObjs == (Gia_Obj_t *)0x0) break;
        iVar3 = clock_gettime(3,&local_70);
        if (iVar3 < 0) {
          lVar7 = 1;
        }
        else {
          lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
          lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_70.tv_sec * -1000000;
        }
        local_54 = iVar2;
        local_38 = lVar6;
        satoko_assump_push(s,iVar2);
        pCVar1 = local_50;
        local_40 = lVar6 + 1;
        pVVar5 = Gia_ManCollectVars((int)(lVar6 + 1),local_50->vMapping,local_50->nVars);
        pvars = pVVar5->pArray;
        n_vars = pVVar5->nSize;
        satoko_mark_cone(s,pvars,n_vars);
        printf("Cone has %6d vars (out of %6d).  ",(ulong)n_vars,(ulong)(uint)pCVar1->nVars);
        iVar3 = satoko_solve(s);
        satoko_unmark_cone(s,pvars,n_vars);
        if (pvars != (int *)0x0) {
          free(pvars);
          pVVar5->pArray = (int *)0x0;
        }
        if (pVVar5 != (Vec_Int_t *)0x0) {
          free(pVVar5);
        }
        satoko_assump_pop(s);
        iVar4 = clock_gettime(3,&local_70);
        iVar2 = local_54;
        if (iVar4 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        Gia_ManSatokoReport((int)local_38,iVar3,lVar6 + lVar7);
        pVVar5 = local_48->vCos;
        iVar2 = iVar2 + 2;
        lVar6 = local_40;
      } while (local_40 < pVVar5->nSize);
    }
    Cnf_DataFree(local_50);
    satoko_destroy(s);
    iVar3 = 3;
    iVar2 = clock_gettime(3,&local_70);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    lVar7 = lVar7 + local_60;
    Abc_Print(iVar3,"%s =","Total time");
  }
  Abc_Print(iVar3,"%9.2f sec\n",(double)lVar7 / 1000000.0);
  return;
}

Assistant:

void Gia_ManSatokoCall( Gia_Man_t * p, satoko_opts_t * opts, int fSplit, int fIncrem )
{
    int fUseCone = 1;
    Gia_Man_t * pOne;
    Gia_Obj_t * pRoot;
    Vec_Int_t * vCone;
    int i, iLit, status;
    if ( fIncrem )
    {
        abctime clk = Abc_Clock();
        Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, fUseCone, 0 );
        satoko_t * pSat = Gia_ManSatokoInit( pCnf, opts );
        Gia_ManForEachCo( p, pRoot, i )
        {
            abctime clk = Abc_Clock();
            iLit = Abc_Var2Lit( i+1, 0 );
            satoko_assump_push( pSat, iLit );
            if ( fUseCone )
            {
                vCone = Gia_ManCollectVars( i+1, pCnf->vMapping, pCnf->nVars );
                satoko_mark_cone( pSat, Vec_IntArray(vCone), Vec_IntSize(vCone) );
                printf( "Cone has %6d vars (out of %6d).  ", Vec_IntSize(vCone), pCnf->nVars );
                status = satoko_solve( pSat );
                satoko_unmark_cone( pSat, Vec_IntArray(vCone), Vec_IntSize(vCone) );
                Vec_IntFree( vCone );
            }
            else
            {
                status = satoko_solve( pSat );
            }
            satoko_assump_pop( pSat );
            Gia_ManSatokoReport( i, status, Abc_Clock() - clk );
        }
        Cnf_DataFree( pCnf );
        satoko_destroy( pSat );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
        return;
    }
    if ( fSplit )
    {
        abctime clk = Abc_Clock();
        Gia_ManForEachCo( p, pRoot, i )
        {
            pOne = Gia_ManDupDfsCone( p, pRoot );
            Gia_ManSatokoCallOne( pOne, opts, i );
            Gia_ManStop( pOne );
        }
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
        return;
    }
    Gia_ManSatokoCallOne( p, opts, -1 );
}